

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O2

void __thiscall
TestChain100Setup::TestChain100Setup(TestChain100Setup *this,ChainType chain_type,TestOpts opts)

{
  bool bVar1;
  Chainstate *pCVar2;
  TestOpts *in_RDX;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock27;
  TestOpts local_a8;
  base_blob<256u> local_88 [32];
  string local_68;
  array<unsigned_char,_32UL> vchKey;
  uchar local_28 [8];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  TestOpts::TestOpts(&local_a8,in_RDX);
  TestingSetup::TestingSetup(&this->super_TestingSetup,REGTEST,_criticalblock27);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)&local_a8);
  (this->coinbaseKey).keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (array<unsigned_char,_32UL> *)0x0;
  (this->m_coinbase_txns).
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_coinbase_txns).
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_coinbase_txns).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->m_coinbase_txns).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  SetMockTime(0x5f4d1810);
  vchKey._M_elems[0x10] = '\0';
  vchKey._M_elems[0x11] = '\0';
  vchKey._M_elems[0x12] = '\0';
  vchKey._M_elems[0x13] = '\0';
  vchKey._M_elems[0x14] = '\0';
  vchKey._M_elems[0x15] = '\0';
  vchKey._M_elems[0x16] = '\0';
  vchKey._M_elems[0x17] = '\0';
  vchKey._M_elems[0x18] = '\0';
  vchKey._M_elems[0x19] = '\0';
  vchKey._M_elems[0x1a] = '\0';
  vchKey._M_elems[0x1b] = '\0';
  vchKey._M_elems[0x1c] = '\0';
  vchKey._M_elems[0x1d] = '\0';
  vchKey._M_elems[0x1e] = '\0';
  vchKey._M_elems[0x1f] = '\x01';
  vchKey._M_elems[0] = '\0';
  vchKey._M_elems[1] = '\0';
  vchKey._M_elems[2] = '\0';
  vchKey._M_elems[3] = '\0';
  vchKey._M_elems[4] = '\0';
  vchKey._M_elems[5] = '\0';
  vchKey._M_elems[6] = '\0';
  vchKey._M_elems[7] = '\0';
  vchKey._M_elems[8] = '\0';
  vchKey._M_elems[9] = '\0';
  vchKey._M_elems[10] = '\0';
  vchKey._M_elems[0xb] = '\0';
  vchKey._M_elems[0xc] = '\0';
  vchKey._M_elems[0xd] = '\0';
  vchKey._M_elems[0xe] = '\0';
  vchKey._M_elems[0xf] = '\0';
  CKey::Set<unsigned_char_const*>(&this->coinbaseKey,vchKey._M_elems,local_28,true);
  mineBlocks(this,100);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock27,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
             ,0x15e,false);
  pCVar2 = ChainstateManager::ActiveChainstate
                     ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                      m_node.chainman._M_t.
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  CBlockIndex::GetBlockHash
            ((uint256 *)local_88,
             (pCVar2->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1]);
  base_blob<256u>::ToString_abi_cxx11_(&local_68,local_88);
  bVar1 = std::operator==(&local_68,
                          "571d80a9967ae599cec0448b0b0ba1cfb606f584d8069bd7166b86854ba7a191");
  if (!bVar1) {
    __assert_fail("m_node.chainman->ActiveChain().Tip()->GetBlockHash().ToString() == \"571d80a9967ae599cec0448b0b0ba1cfb606f584d8069bd7166b86854ba7a191\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                  ,0x161,"TestChain100Setup::TestChain100Setup(const ChainType, TestOpts)");
  }
  std::__cxx11::string::~string((string *)&local_68);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock27.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

TestChain100Setup::TestChain100Setup(
    const ChainType chain_type,
    TestOpts opts)
    : TestingSetup{ChainType::REGTEST, opts}
{
    SetMockTime(1598887952);
    constexpr std::array<unsigned char, 32> vchKey = {
        {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 1}};
    coinbaseKey.Set(vchKey.begin(), vchKey.end(), true);

    // Generate a 100-block chain:
    this->mineBlocks(COINBASE_MATURITY);

    {
        LOCK(::cs_main);
        assert(
            m_node.chainman->ActiveChain().Tip()->GetBlockHash().ToString() ==
            "571d80a9967ae599cec0448b0b0ba1cfb606f584d8069bd7166b86854ba7a191");
    }
}